

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

parser<pstore::exchange::import_ns::callbacks> * __thiscall
pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
          (parser<pstore::exchange::import_ns::callbacks> *this,string *src)

{
  parser<pstore::exchange::import_ns::callbacks> *ppVar1;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_18;
  
  local_18 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             gsl::make_span<std::__cxx11::string>(src);
  ppVar1 = input<pstore::gsl::span<char_const,_1l>>(this,(span<const_char,__1L> *)&local_18);
  return ppVar1;
}

Assistant:

parser & input (std::string const & src) { return this->input (gsl::make_span (src)); }